

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

TSNode * ts_node_named_descendant_for_byte_range
                   (TSNode *__return_storage_ptr__,TSNode self,uint32_t min,uint32_t max)

{
  ts_node__descendant_for_byte_range(__return_storage_ptr__,self,min,max,false);
  return __return_storage_ptr__;
}

Assistant:

TSNode ts_node_named_descendant_for_byte_range(TSNode self, uint32_t min, uint32_t max) {
  return ts_node__descendant_for_byte_range(self, min, max, false);
}